

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::paintEvent(QListView *this,QPaintEvent *e)

{
  bool bVar1;
  QListViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  Data *pDVar4;
  QRect QVar5;
  QRect QVar6;
  State SVar7;
  QFlagsStorage<QStyle::StateFlag> QVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  State SVar13;
  QWidget *this_01;
  QSize QVar14;
  QModelIndex *pQVar15;
  ulong uVar16;
  long *plVar17;
  Representation RVar18;
  State SVar19;
  int iVar20;
  QModelIndex *rhs;
  QModelIndex *pQVar21;
  byte bVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  QRect QVar25;
  QRect local_1f8;
  QRect local_1e8;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1c8;
  undefined1 *local_1b8;
  undefined1 *puStack_1b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1a8;
  QArrayDataPointer<QModelIndex> local_198;
  QStylePainter local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 *local_138;
  QPalettePrivate *pQStack_130;
  undefined1 *local_128;
  QObject *pQStack_120;
  undefined1 *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar9 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(this_00->super_QAbstractItemViewPrivate).itemDelegate);
  QVar25.x2.m_i = local_148._8_4_;
  QVar25.y2.m_i = local_148._12_4_;
  QVar25.x1.m_i = local_148._0_4_;
  QVar25.y1.m_i = local_148._4_4_;
  if (bVar9) {
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_178.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_178.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter
              (&local_178,
               (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport);
    local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_198.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    iVar11 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget + 0x2b0))(this);
    iVar12 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget + 0x2b8))(this);
    local_158 = (undefined1  [16])QRect::translated((QRect *)(e + 0x10),iVar11,iVar12);
    QListViewPrivate::intersectingSet
              ((QList<QModelIndex> *)&local_198,this_00,(QRect *)local_158,false);
    local_1a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex((QModelIndex *)&local_1b8,(QAbstractItemView *)this);
    local_1c8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_1d8,&(this_00->super_QAbstractItemViewPrivate).hover);
    pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
    pDVar3 = (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar21 = (QModelIndex *)0x0;
    }
    else {
      pQVar21 = (QModelIndex *)(this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value;
    }
    bVar9 = QWidget::hasFocus((QWidget *)this);
    if ((bVar9) ||
       (bVar9 = QWidget::hasFocus((this_00->super_QAbstractItemViewPrivate).
                                  super_QAbstractScrollAreaPrivate.viewport), bVar9)) {
      bVar9 = false;
      if ((-1 < (int)local_1b8) && (-1 < (long)local_1b8)) {
        bVar9 = local_1a8.ptr != (QAbstractItemModel *)0x0;
      }
    }
    else {
      bVar9 = false;
    }
    SVar7.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_108.super_QStyleOption.state;
    bVar1 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
    SVar13 = QAbstractItemView::state((QAbstractItemView *)this);
    iVar11 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8 + 0x558);
    this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QVar14 = QWidget::size(this_01);
    if (iVar11 == 1) {
      RVar18 = (this_00->commonListView->contentsSize).wd;
    }
    else {
      QVar14 = (QSize)((ulong)QVar14 >> 0x20);
      RVar18.m_i = (this_00->commonListView->contentsSize).ht.m_i;
    }
    if (RVar18.m_i < QVar14.wd.m_i.m_i) {
      RVar18.m_i = QVar14.wd.m_i.m_i;
    }
    iVar12 = RVar18.m_i + this_00->space * -2;
    pQVar15 = local_198.ptr + local_198.size;
    iVar11 = -2;
    bVar22 = 0;
    for (rhs = local_198.ptr; rhs != pQVar15; rhs = rhs + 1) {
      auVar24 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x1e0))(this,rhs);
      local_108.super_QStyleOption.rect._8_8_ = auVar24._8_8_;
      local_108.super_QStyleOption.rect._0_8_ = auVar24._0_8_;
      bVar23 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                  super_QFrame.super_QWidget.field_0x8 + 0x558) != 1;
      uVar16 = (ulong)local_108.super_QStyleOption.rect._0_8_ >> 0x20;
      if (!bVar23) {
        uVar16 = local_108.super_QStyleOption.rect._0_8_;
      }
      iVar20 = auVar24._12_4_;
      if (!bVar23) {
        iVar20 = auVar24._8_4_;
      }
      iVar20 = (iVar20 - (int)uVar16) + 1;
      if (iVar12 < iVar20) {
        iVar20 = iVar12;
      }
      (&local_108.super_QStyleOption.rect.x2)[bVar23].m_i = (int)uVar16 + -1 + iVar20;
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)SVar7;
      if ((pQVar21 != (QModelIndex *)0x0) &&
         (cVar10 = QItemSelectionModel::isSelected(pQVar21), cVar10 != '\0')) {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i | 0x8000);
      }
      if (((uint)SVar7.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
        uVar16 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,rhs);
        bVar23 = (uVar16 & 0x20) == 0;
        if (bVar23) {
          local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorageHelper<QStyle::StateFlag,_4>)
               ((uint)local_108.super_QStyleOption.state.
                      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                      super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffffe);
        }
        local_108.super_QStyleOption.palette.currentGroup = (ColorGroup)bVar23;
      }
      QVar8.i = (Int)local_108.super_QStyleOption.state;
      if (((bVar9) &&
          (bVar23 = ::comparesEqual((QModelIndex *)&local_1b8,rhs),
          QVar8.i = (Int)local_108.super_QStyleOption.state, bVar23)) &&
         (QVar8.i = (uint)local_108.super_QStyleOption.state.
                          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i | 0x100, SVar13 == EditingState))
      {
        QVar8.i = (uint)local_108.super_QStyleOption.state.
                        super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i | 0x400100;
      }
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)QVar8.i;
      bVar23 = ::comparesEqual(rhs,(QModelIndex *)&local_1d8);
      SVar19.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.
      i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)
          ((uint)bVar23 << 0xd |
          (uint)local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff);
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           SVar19.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i;
      if (bVar1 != false) {
        iVar20 = rhs->r;
        iVar11 = iVar11 + 1;
        if (iVar20 != iVar11) {
          pDVar4 = (this_00->hiddenRows).q_hash.d;
          if ((pDVar4 == (Data *)0x0) || (pDVar4->size == 0)) {
            bVar22 = (byte)iVar20;
          }
          else {
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            for (; SVar19.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i =
                        (QFlagsStorageHelper<QStyle::StateFlag,_4>)
                        (QFlagsStorageHelper<QStyle::StateFlag,_4>)
                        local_108.super_QStyleOption.state, iVar11 < iVar20; iVar11 = iVar11 + 1) {
              bVar23 = QListViewPrivate::isHidden(this_00,iVar11);
              bVar22 = bVar23 ^ bVar22 ^ 1;
            }
          }
        }
        local_108.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
             (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
             (((uint)local_108.features.
                     super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                     super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd) +
             (bVar22 & 1) * 2);
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)SVar19.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i & 0xffff7fff);
        QStylePainter::drawPrimitive(&local_178,PE_PanelItemViewRow,&local_108.super_QStyleOption);
        bVar22 = bVar22 ^ 1;
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             SVar19.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i;
        iVar11 = iVar20;
      }
      plVar17 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget
                                    + 0x208))(this,rhs);
      (**(code **)(*plVar17 + 0x60))(plVar17,&local_178,&local_108,rhs);
    }
    (*this_00->commonListView->_vptr_QCommonListViewBase[0x14])(this_00->commonListView,&local_178);
    QVar6.x2.m_i = local_148._8_4_;
    QVar6.y2.m_i = local_148._12_4_;
    QVar6.x1.m_i = local_148._0_4_;
    QVar6.y1.m_i = local_148._4_4_;
    QVar5.x2.m_i = local_148._8_4_;
    QVar5.y2.m_i = local_148._12_4_;
    QVar5.x1.m_i = local_148._0_4_;
    QVar5.y1.m_i = local_148._4_4_;
    if (((this_00->showElasticBand != false) &&
        (local_148 = (undefined1  [16])QVar5,
        (this_00->elasticBand).x1.m_i <= (this_00->elasticBand).x2.m_i)) &&
       (local_148 = (undefined1  [16])QVar6,
       (this_00->elasticBand).y1.m_i <= (this_00->elasticBand).y2.m_i)) {
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_120 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_130 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)local_158);
      QStyleOption::initFrom((QStyleOption *)local_158,(QWidget *)this);
      local_118 = (undefined1 *)CONCAT35(local_118._5_3_,1);
      local_1e8 = QListViewPrivate::mapToViewport(this_00,&this_00->elasticBand,false);
      QVar25 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.viewport);
      auVar24._12_4_ = QVar25.y2.m_i;
      auVar24._0_4_ = (undefined4)(QVar25._0_8_ + 0xfffffff0);
      auVar24._8_4_ = (undefined4)(QVar25._8_8_ + 0x10);
      auVar24._4_4_ = auVar24._8_4_;
      local_1f8._0_8_ = CONCAT44(QVar25.y1.m_i.m_i,auVar24._0_4_) + -0x1000000000;
      local_1f8._8_8_ = auVar24._8_8_ + 0x1000000000;
      local_148 = QRect::operator&(&local_1e8,&local_1f8);
      QPainter::save();
      QStylePainter::drawControl(&local_178,CE_RubberBand,(QStyleOption *)local_158);
      QPainter::restore();
      QStyleOption::~QStyleOption((QStyleOption *)local_158);
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_198);
    QPainter::~QPainter(&local_178.super_QPainter);
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
    QVar25 = (QRect)local_148;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_148 = (undefined1  [16])QVar25;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::paintEvent(QPaintEvent *e)
{
    Q_D(QListView);
    if (!d->itemDelegate)
        return;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QStylePainter painter(d->viewport);

    const QList<QModelIndex> toBeRendered =
            d->intersectingSet(e->rect().translated(horizontalOffset(), verticalOffset()), false);

    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const QAbstractItemModel *itemModel = d->model;
    const QItemSelectionModel *selections = d->selectionModel;
    const bool focus = (hasFocus() || d->viewport->hasFocus()) && current.isValid();
    const bool alternate = d->alternatingColors;
    const QStyle::State state = option.state;
    const QAbstractItemView::State viewState = this->state();
    const bool enabled = (state & QStyle::State_Enabled) != 0;

    bool alternateBase = false;
    int previousRow = -2; // trigger the alternateBase adjustment on first pass

    int maxSize = (flow() == TopToBottom)
        ? qMax(viewport()->size().width(), d->contentsSize().width()) - 2 * d->spacing()
        : qMax(viewport()->size().height(), d->contentsSize().height()) - 2 * d->spacing();

    QList<QModelIndex>::const_iterator end = toBeRendered.constEnd();
    for (QList<QModelIndex>::const_iterator it = toBeRendered.constBegin(); it != end; ++it) {
        Q_ASSERT((*it).isValid());
        option.rect = visualRect(*it);

        if (flow() == TopToBottom)
            option.rect.setWidth(qMin(maxSize, option.rect.width()));
        else
            option.rect.setHeight(qMin(maxSize, option.rect.height()));

        option.state = state;
        if (selections && selections->isSelected(*it))
            option.state |= QStyle::State_Selected;
        if (enabled) {
            QPalette::ColorGroup cg;
            if ((itemModel->flags(*it) & Qt::ItemIsEnabled) == 0) {
                option.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else {
                cg = QPalette::Normal;
            }
            option.palette.setCurrentColorGroup(cg);
        }
        if (focus && current == *it) {
            option.state |= QStyle::State_HasFocus;
            if (viewState == EditingState)
                option.state |= QStyle::State_Editing;
        }
        option.state.setFlag(QStyle::State_MouseOver, *it == hover);

        if (alternate) {
            int row = (*it).row();
            if (row != previousRow + 1) {
                // adjust alternateBase according to rows in the "gap"
                if (!d->hiddenRows.isEmpty()) {
                    for (int r = qMax(previousRow + 1, 0); r < row; ++r) {
                        if (!d->isHidden(r))
                            alternateBase = !alternateBase;
                    }
                } else {
                    alternateBase = (row & 1) != 0;
                }
            }
            option.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = option.state;
            option.state &= ~QStyle::State_Selected;
            painter.drawPrimitive(QStyle::PE_PanelItemViewRow, option);
            option.state = oldState;

            alternateBase = !alternateBase;
            previousRow = row;
        }

        itemDelegateForIndex(*it)->paint(&painter, option, *it);
    }

#if QT_CONFIG(draganddrop)
    d->commonListView->paintDragDrop(&painter);
#endif

#if QT_CONFIG(rubberband)
    // #### move this implementation into a dynamic class
    if (d->showElasticBand && d->elasticBand.isValid()) {
        QStyleOptionRubberBand opt;
        opt.initFrom(this);
        opt.shape = QRubberBand::Rectangle;
        opt.opaque = false;
        opt.rect = d->mapToViewport(d->elasticBand, false).intersected(
            d->viewport->rect().adjusted(-16, -16, 16, 16));
        painter.save();
        painter.drawControl(QStyle::CE_RubberBand, opt);
        painter.restore();
    }
#endif
}